

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetictest.cpp
# Opt level: O2

double * getRandomTipPartials(int nsites,int stateCount)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  
  pdVar2 = (double *)calloc(8,(long)(nsites * stateCount));
  for (lVar3 = 0; (int)lVar3 < nsites * stateCount; lVar3 = lVar3 + stateCount) {
    iVar1 = gt_rand();
    pdVar2[iVar1 % stateCount + lVar3] = 1.0;
  }
  return pdVar2;
}

Assistant:

double* getRandomTipPartials( int nsites, int stateCount )
{
    double *partials = (double*) calloc(sizeof(double), nsites * stateCount); // 'malloc' was a bug
    for( int i=0; i<nsites*stateCount; i+=stateCount )
    {
        int s = gt_rand()%stateCount;
        // printf("%d ", s);
        partials[i+s]=1.0;
    }
    return partials;
}